

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,bool sparse)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TransitionModelMappingSparse *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  EOverflow *this_01;
  ulong uVar9;
  double p1;
  
  if ((this->_m_A)._m_jointIndicesValid != false) {
    if ((this->_m_cached_FlatTM == true) && (this->_m_p_tModel != (TransitionModelDiscrete *)0x0)) {
      (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
        _vptr_TransitionModel[1])();
    }
    this->_m_sparse_FlatTM = sparse;
    this_00 = (TransitionModelMappingSparse *)operator_new(0x28);
    pcVar1 = *(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70);
    if (sparse) {
      iVar3 = (*pcVar1)(this);
      iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMappingSparse::TransitionModelMappingSparse(this_00,iVar3,iVar4);
    }
    else {
      iVar3 = (*pcVar1)(this);
      iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMapping::TransitionModelMapping((TransitionModelMapping *)this_00,iVar3,iVar4);
    }
    this->_m_p_tModel = (TransitionModelDiscrete *)this_00;
    lVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
    if (lVar5 != 0) {
      uVar9 = 0;
      do {
        lVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        if (lVar5 != 0) {
          uVar8 = 0;
          do {
            lVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
            if (lVar5 != 0) {
              uVar7 = 0;
              do {
                p1 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x1e0))
                                       (this,uVar9,uVar8,uVar7);
                bVar2 = Globals::EqualProbability(p1,0.0);
                if (!bVar2) {
                  (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).
                    super_TransitionModel._vptr_TransitionModel[5])
                            (p1,this->_m_p_tModel,uVar9,uVar8,uVar7);
                }
                uVar7 = (ulong)((int)uVar7 + 1);
                uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
              } while (uVar7 < uVar6);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
          } while (uVar8 < uVar7);
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar8 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
      } while (uVar9 < uVar8);
    }
    this->_m_cached_FlatTM = true;
    return;
  }
  this_01 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow
            (this_01,
             "MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel() joint action indices are not available, overflow detected"
            );
  __cxa_throw(this_01,&EOverflow::typeinfo,E::~E);
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel(bool sparse)
{
    if(!JointAIndicesValid())
        throw EOverflow("MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel() joint action indices are not available, overflow detected");

    if(_m_cached_FlatTM)
        delete(_m_p_tModel);

    _m_sparse_FlatTM = sparse;
    if(sparse)
        _m_p_tModel=new TransitionModelMappingSparse(GetNrStates(),
                                                     GetNrJointActions());
    else
        _m_p_tModel=new TransitionModelMapping(GetNrStates(),
                                               GetNrJointActions());


    for(Index sI=0; sI<GetNrStates(); sI++)
        for(Index jaI=0; jaI<GetNrJointActions(); jaI++)
            for(Index sucsI=0; sucsI<GetNrStates(); sucsI++)
            {
                double p = GetTransitionProbability(sI, jaI, sucsI);
                if(! Globals::EqualProbability(p, 0) )                
                    _m_p_tModel->Set(sI, jaI, sucsI, p);
            }

    _m_cached_FlatTM = true;
}